

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

int __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::FindPath
          (GraphCycles *this,GraphId idx,GraphId idy,int max_path_len,GraphId *path)

{
  Vec<int> *this_00;
  uint32_t uVar1;
  Rep *pRVar2;
  Node **ppNVar3;
  Node *pNVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int32_t w;
  int32_t _cursor;
  int32_t x;
  NodeSet seen;
  int local_94;
  int local_90;
  int local_8c;
  int32_t local_88;
  int local_84;
  GraphCycles *local_80;
  GraphId *local_78;
  uint64_t local_70;
  NodeSet local_68;
  
  pRVar2 = this->rep_;
  ppNVar3 = (pRVar2->nodes_).ptr_;
  local_84 = (int)idx.handle;
  pNVar4 = ppNVar3[idx.handle & 0xffffffff];
  iVar7 = 0;
  local_94 = 0;
  if ((((pNVar4 != (Node *)0x0) &&
       (local_94 = iVar7, pNVar4->version == (uint32_t)(idx.handle >> 0x20))) &&
      (pNVar4 = ppNVar3[idy.handle & 0xffffffff], pNVar4 != (Node *)0x0)) &&
     (pNVar4->version == (uint32_t)(idy.handle >> 0x20))) {
    local_8c = max_path_len;
    local_80 = this;
    local_78 = path;
    local_70 = idy.handle;
    synchronization_internal::anon_unknown_0::NodeSet::NodeSet(&local_68);
    this_00 = &pRVar2->stack_;
    synchronization_internal::anon_unknown_0::Vec<int>::clear(this_00);
    synchronization_internal::anon_unknown_0::Vec<int>::push_back(this_00,&local_84);
    local_94 = 0;
    while (uVar1 = (pRVar2->stack_).size_, uVar1 != 0) {
      uVar6 = uVar1 - 1;
      iVar7 = (pRVar2->stack_).ptr_[uVar6];
      uVar8 = (ulong)iVar7;
      (pRVar2->stack_).size_ = uVar6;
      if ((long)uVar8 < 0) {
        local_94 = local_94 + -1;
      }
      else {
        if (local_94 < local_8c) {
          local_78[local_94].handle =
               (ulong)(local_80->rep_->nodes_).ptr_[uVar8]->version << 0x20 | uVar8;
        }
        local_90 = -1;
        synchronization_internal::anon_unknown_0::Vec<int>::push_back(this_00,&local_90);
        local_94 = local_94 + 1;
        if (iVar7 == (int)local_70) goto LAB_003f5037;
        local_88 = 0;
        while (bVar5 = synchronization_internal::anon_unknown_0::NodeSet::Next
                                 (&(pRVar2->nodes_).ptr_[uVar8]->out,&local_88,&local_90), bVar5) {
          bVar5 = synchronization_internal::anon_unknown_0::NodeSet::insert(&local_68,local_90);
          if (bVar5) {
            synchronization_internal::anon_unknown_0::Vec<int>::push_back(this_00,&local_90);
          }
        }
      }
    }
    local_94 = 0;
LAB_003f5037:
    synchronization_internal::anon_unknown_0::Vec<int>::~Vec(&local_68.table_);
  }
  return local_94;
}

Assistant:

int GraphCycles::FindPath(GraphId idx, GraphId idy, int max_path_len,
                          GraphId path[]) const {
  Rep* r = rep_;
  if (FindNode(r, idx) == nullptr || FindNode(r, idy) == nullptr) return 0;
  const int32_t x = NodeIndex(idx);
  const int32_t y = NodeIndex(idy);

  // Forward depth first search starting at x until we hit y.
  // As we descend into a node, we push it onto the path.
  // As we leave a node, we remove it from the path.
  int path_len = 0;

  NodeSet seen;
  r->stack_.clear();
  r->stack_.push_back(x);
  while (!r->stack_.empty()) {
    int32_t n = r->stack_.back();
    r->stack_.pop_back();
    if (n < 0) {
      // Marker to indicate that we are leaving a node
      path_len--;
      continue;
    }

    if (path_len < max_path_len) {
      path[path_len] =
          MakeId(n, rep_->nodes_[static_cast<uint32_t>(n)]->version);
    }
    path_len++;
    r->stack_.push_back(-1);  // Will remove tentative path entry

    if (n == y) {
      return path_len;
    }

    HASH_FOR_EACH(w, r->nodes_[static_cast<uint32_t>(n)]->out) {
      if (seen.insert(w)) {
        r->stack_.push_back(w);
      }
    }
  }

  return 0;
}